

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Stop(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  APlayerPawn *pAVar1;
  player_t *ppVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  char *__assertion;
  bool bVar6;
  PClass *pPVar5;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    pAVar1 = (APlayerPawn *)(param->field_0).field_1.a;
    pPVar5 = (pAVar1->super_AActor).super_DThinker.super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar1);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (pAVar1->super_AActor).super_DThinker.super_DObject.Class = pPVar5;
    }
    bVar6 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar6) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (bVar6) {
      (pAVar1->super_AActor).Vel.X = 0.0;
      (pAVar1->super_AActor).Vel.Y = 0.0;
      (pAVar1->super_AActor).Vel.Z = 0.0;
      ppVar2 = (pAVar1->super_AActor).player;
      if (((ppVar2 != (player_t *)0x0) && (ppVar2->mo == pAVar1)) &&
         ((ppVar2->cheats & 0x2000) == 0)) {
        APlayerPawn::PlayIdle(ppVar2->mo);
        ppVar2 = (pAVar1->super_AActor).player;
        (ppVar2->Vel).X = 0.0;
        (ppVar2->Vel).Y = 0.0;
      }
      return 0;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xecf,"int AF_AActor_A_Stop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Stop)
{
	PARAM_SELF_PROLOGUE(AActor);
	self->Vel.Zero();
	if (self->player && self->player->mo == self && !(self->player->cheats & CF_PREDICTING))
	{
		self->player->mo->PlayIdle();
		self->player->Vel.Zero();
	}
	return 0;
}